

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O2

xmlChar * xmlC11NNormalizeString(xmlChar *input,xmlC14NNormalizationMode mode)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  xmlChar xVar3;
  xmlChar *cur;
  char *extra;
  long lVar4;
  int iVar5;
  
  if (input == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  pxVar1 = (xmlChar *)(*xmlMallocAtomic)(1000);
  if (pxVar1 == (xmlChar *)0x0) {
    extra = "allocating buffer";
LAB_0013899e:
    xmlC14NErrMemory(extra);
    pxVar1 = (xmlChar *)0x0;
  }
  else {
    iVar5 = 1000;
    pxVar2 = pxVar1;
    for (; xVar3 = *input, xVar3 != '\0'; input = input + 1) {
      lVar4 = (long)pxVar2 - (long)pxVar1;
      if (iVar5 + -10 < lVar4) {
        iVar5 = iVar5 * 2;
        pxVar1 = (xmlChar *)(*xmlRealloc)(pxVar1,(long)iVar5);
        if (pxVar1 == (xmlChar *)0x0) {
          extra = "growing buffer";
          goto LAB_0013899e;
        }
        pxVar2 = pxVar1 + (int)lVar4;
        xVar3 = *input;
      }
      if (xVar3 == '<') {
        if ((mode == XMLC14N_NORMALIZE_TEXT) || (mode == XMLC14N_NORMALIZE_ATTR)) {
          builtin_memcpy(pxVar2,"&lt;",4);
LAB_001388db:
          pxVar2 = pxVar2 + 4;
        }
        else {
LAB_00138979:
          *pxVar2 = xVar3;
          pxVar2 = pxVar2 + 1;
        }
      }
      else {
        if (xVar3 == '>' && mode == XMLC14N_NORMALIZE_TEXT) {
          builtin_memcpy(pxVar2,"&gt;",4);
          goto LAB_001388db;
        }
        if (xVar3 == '&') {
          if ((mode != XMLC14N_NORMALIZE_TEXT) && (mode != XMLC14N_NORMALIZE_ATTR))
          goto LAB_00138979;
          builtin_memcpy(pxVar2,"&amp",4);
        }
        else {
          if (xVar3 == '\"' && mode == XMLC14N_NORMALIZE_ATTR) {
            builtin_memcpy(pxVar2,"&quot;",6);
            pxVar2 = pxVar2 + 6;
            goto LAB_0013897e;
          }
          if (xVar3 == '\t' && mode == XMLC14N_NORMALIZE_ATTR) {
            builtin_memcpy(pxVar2,"&#x9",4);
          }
          else if (xVar3 == '\n' && mode == XMLC14N_NORMALIZE_ATTR) {
            builtin_memcpy(pxVar2,"&#xA",4);
          }
          else {
            if (xVar3 != '\r' || XMLC14N_NORMALIZE_TEXT < mode) goto LAB_00138979;
            builtin_memcpy(pxVar2,"&#xD",4);
          }
        }
        pxVar2[4] = ';';
        pxVar2 = pxVar2 + 5;
      }
LAB_0013897e:
    }
    *pxVar2 = '\0';
  }
  return pxVar1;
}

Assistant:

static xmlChar *
xmlC11NNormalizeString(const xmlChar * input,
                       xmlC14NNormalizationMode mode)
{
    const xmlChar *cur = input;
    xmlChar *buffer = NULL;
    xmlChar *out = NULL;
    int buffer_size = 0;

    if (input == NULL)
        return (NULL);

    /*
     * allocate an translation buffer.
     */
    buffer_size = 1000;
    buffer = (xmlChar *) xmlMallocAtomic(buffer_size);
    if (buffer == NULL) {
	xmlC14NErrMemory("allocating buffer");
        return (NULL);
    }
    out = buffer;

    while (*cur != '\0') {
        if ((out - buffer) > (buffer_size - 10)) {
            int indx = out - buffer;

            growBufferReentrant();
            out = &buffer[indx];
        }

        if ((*cur == '<') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                              (mode == XMLC14N_NORMALIZE_TEXT))) {
            *out++ = '&';
            *out++ = 'l';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '>') && (mode == XMLC14N_NORMALIZE_TEXT)) {
            *out++ = '&';
            *out++ = 'g';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '&') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                                     (mode == XMLC14N_NORMALIZE_TEXT))) {
            *out++ = '&';
            *out++ = 'a';
            *out++ = 'm';
            *out++ = 'p';
            *out++ = ';';
        } else if ((*cur == '"') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = 'q';
            *out++ = 'u';
            *out++ = 'o';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '\x09') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = '9';
            *out++ = ';';
        } else if ((*cur == '\x0A') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = 'A';
            *out++ = ';';
        } else if ((*cur == '\x0D') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                                        (mode == XMLC14N_NORMALIZE_TEXT) ||
                                        (mode == XMLC14N_NORMALIZE_COMMENT) ||
					(mode == XMLC14N_NORMALIZE_PI))) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = 'D';
            *out++ = ';';
        } else {
            /*
             * Works because on UTF-8, all extended sequences cannot
             * result in bytes in the ASCII range.
             */
            *out++ = *cur;
        }
        cur++;
    }
    *out = 0;
    return (buffer);
}